

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_handler.cpp
# Opt level: O0

ssize_t __thiscall TokenReader::read(TokenReader *this,int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  size_type sVar2;
  reference pvVar3;
  undefined4 in_register_00000034;
  vector<Token,_std::allocator<Token>_> *this_00;
  TokenReader *this_local;
  Token *token;
  
  this_00 = (vector<Token,_std::allocator<Token>_> *)CONCAT44(in_register_00000034,__fd);
  Token::Token((Token *)this);
  iVar1 = *(int *)(this_00 + 0x18);
  sVar2 = std::vector<Token,_std::allocator<Token>_>::size(this_00);
  if ((ulong)(long)iVar1 < sVar2) {
    iVar1 = *(int *)(this_00 + 0x18);
    *(int *)(this_00 + 0x18) = iVar1 + 1;
    pvVar3 = std::vector<Token,_std::allocator<Token>_>::operator[](this_00,(long)iVar1);
    Token::operator=((Token *)this,pvVar3);
  }
  return (ssize_t)this;
}

Assistant:

Token TokenReader::read()
{
    Token token;
    /*std::vector<Token>::iterator iter = m_tokenList.begin();
    if (iter != m_tokenList.end()) {
        token = *iter;
        m_tokenList.erase(iter);
    }*/
    //Modify the implementation of this method mainly because backtrack is supported
    //So the "read" cannot really erase the item, just a position movement.
    if (pos < m_tokenList.size())
        token = m_tokenList[pos++];
    return token;
}